

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

void __thiscall argo::lexer::read_token(lexer *this)

{
  int iVar1;
  json_parser_exception *pjVar2;
  size_t sVar3;
  token local_148;
  token local_118;
  token local_e8;
  token local_b8;
  token local_88;
  token local_48;
  uint local_14;
  lexer *plStack_10;
  int c;
  lexer *this_local;
  
  plStack_10 = this;
  consume_white_space(this);
  local_14 = (*this->m_reader->_vptr_reader[2])();
  iVar1 = isdigit(local_14);
  if (iVar1 == 0) {
    if (local_14 == 0xffffffff) {
      pjVar2 = (json_parser_exception *)__cxa_allocate_exception(0xe0);
      sVar3 = reader::get_byte_index(this->m_reader);
      json_parser_exception::json_parser_exception(pjVar2,unexpected_eof_e,sVar3);
      __cxa_throw(pjVar2,&json_parser_exception::typeinfo,
                  json_parser_exception::~json_parser_exception);
    }
    if (local_14 == 0x22) {
      read_string(this);
    }
    else if (local_14 == 0x2c) {
      token::token(&local_148,value_separator_e);
      token::operator=(&this->m_token,&local_148);
      token::~token(&local_148);
    }
    else if (local_14 == 0x2d) {
      (*this->m_reader->_vptr_reader[3])(this->m_reader,0x2d);
      read_number(this);
    }
    else if (local_14 == 0x3a) {
      token::token(&local_118,name_separator_e);
      token::operator=(&this->m_token,&local_118);
      token::~token(&local_118);
    }
    else if (local_14 == 0x5b) {
      token::token(&local_48,begin_array_e);
      token::operator=(&this->m_token,&local_48);
      token::~token(&local_48);
    }
    else if (local_14 == 0x5d) {
      token::token(&local_88,end_array_e);
      token::operator=(&this->m_token,&local_88);
      token::~token(&local_88);
    }
    else if (local_14 == 0x66) {
      read_false(this);
    }
    else if (local_14 == 0x6e) {
      read_null(this);
    }
    else if (local_14 == 0x74) {
      read_true(this);
    }
    else if (local_14 == 0x7b) {
      token::token(&local_b8,begin_object_e);
      token::operator=(&this->m_token,&local_b8);
      token::~token(&local_b8);
    }
    else {
      if (local_14 != 0x7d) {
        pjVar2 = (json_parser_exception *)__cxa_allocate_exception(0xe0);
        sVar3 = reader::get_byte_index(this->m_reader);
        json_parser_exception::json_parser_exception(pjVar2,invalid_character_e,sVar3);
        __cxa_throw(pjVar2,&json_parser_exception::typeinfo,
                    json_parser_exception::~json_parser_exception);
      }
      token::token(&local_e8,end_object_e);
      token::operator=(&this->m_token,&local_e8);
      token::~token(&local_e8);
    }
  }
  else {
    (*this->m_reader->_vptr_reader[3])(this->m_reader,(ulong)local_14);
    read_number(this);
  }
  return;
}

Assistant:

void lexer::read_token()
{
    consume_white_space();
    int c = m_reader.next();

    if (isdigit(c))
    {
        m_reader.put_back(c);
        read_number();
    }
    else
    {
        switch (c)
        {
        case '[':
            m_token = token(token::begin_array_e);
            break;
        case ']':
            m_token = token(token::end_array_e);
            break;
        case '{':
            m_token = token(token::begin_object_e);
            break;
        case '}':
            m_token = token(token::end_object_e);
            break;
        case ':':
            m_token = token(token::name_separator_e);
            break;
        case ',':
            m_token = token(token::value_separator_e);
            break;
        case '-':
            m_reader.put_back(c);
            read_number();
            break;
        case '"':
            read_string();
            break;
        case 'f':
            read_false();
            break;
        case 't':
            read_true();
            break;
        case 'n':
            read_null();
            break;
        case EOF:
            throw json_parser_exception(json_parser_exception::unexpected_eof_e, m_reader.get_byte_index());
        default:
            throw json_parser_exception(json_parser_exception::invalid_character_e, m_reader.get_byte_index());
        }
    }
}